

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<double,_std::allocator<double>_> *
mult_matrix_on_constant<double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *a,double *C)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  int local_38;
  int i;
  allocator<double> local_26;
  undefined1 local_25;
  int local_24;
  double *pdStack_20;
  int n;
  double *C_local;
  vector<double,_std::allocator<double>_> *a_local;
  vector<double,_std::allocator<double>_> *ans;
  
  pdStack_20 = C;
  C_local = (double *)a;
  a_local = __return_storage_ptr__;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(a);
  local_24 = (int)sVar3;
  local_25 = 0;
  sVar3 = (size_type)local_24;
  std::allocator<double>::allocator(&local_26);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,sVar3,&local_26);
  std::allocator<double>::~allocator(&local_26);
  for (local_38 = 0; local_38 < local_24; local_38 = local_38 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)C_local,(long)local_38);
    dVar1 = *pvVar4;
    dVar2 = *pdStack_20;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)local_38);
    *pvVar5 = dVar1 * dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> mult_matrix_on_constant(const std::vector<T>& a, const T& C){
    int n = a.size();
    std::vector<T> ans(n);
    for (int i = 0; i < n; ++i)
        ans[i] = a[i]*C;
    return ans;
}